

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O0

outer_range_iterator __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
::skip_while_less(semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
                  *this,outer_range_iterator range,outer_range_iterator candidate)

{
  bool bVar1;
  iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *piVar2;
  reference piVar3;
  reference piVar4;
  reference piVar5;
  semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
  *this_local;
  outer_range_iterator candidate_local;
  outer_range_iterator range_local;
  
  this_local = (semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
                *)candidate._M_current;
  candidate_local._M_current = range._M_current;
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&candidate_local,
                       (__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
                        *)&this_local);
    if (!bVar1) {
      return (outer_range_iterator)(outer_range_iterator)candidate_local._M_current;
    }
    piVar2 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
             __gnu_cxx::
             __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
             ::operator->(&candidate_local);
    piVar3 = boost::iterator_range_detail::
             iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::front
                       (piVar2);
    piVar2 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
             __gnu_cxx::
             __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
             ::operator->((__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
                           *)&this_local);
    piVar4 = boost::iterator_range_detail::
             iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::front
                       (piVar2);
    bVar1 = std::greater<void>::operator()((greater<void> *)&this->field_0x18,piVar3,piVar4);
    if (bVar1) {
      piVar5 = __gnu_cxx::
               __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
               ::operator*(&candidate_local);
      piVar2 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
               __gnu_cxx::
               __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
               ::operator->((__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
                             *)&this_local);
      piVar3 = boost::iterator_range_detail::
               iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::
               front(piVar2);
      skip_to_lower_bound<boost::iterator_range<int_const*>,int,std::greater<void>>(piVar5,piVar3);
      piVar2 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
               __gnu_cxx::
               __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
               ::operator->(&candidate_local);
      bVar1 = boost::iterator_range_detail::
              iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::empty
                        (piVar2);
      if (bVar1) {
        return (outer_range_iterator)(outer_range_iterator)candidate_local._M_current;
      }
      piVar2 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
               __gnu_cxx::
               __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
               ::operator->((__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
                             *)&this_local);
      piVar3 = boost::iterator_range_detail::
               iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::
               front(piVar2);
      piVar2 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
               __gnu_cxx::
               __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
               ::operator->(&candidate_local);
      piVar4 = boost::iterator_range_detail::
               iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::
               front(piVar2);
      bVar1 = std::greater<void>::operator()((greater<void> *)&this->field_0x18,piVar3,piVar4);
      if (bVar1) {
        return (outer_range_iterator)(outer_range_iterator)candidate_local._M_current;
      }
    }
    __gnu_cxx::
    __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
    ::operator++(&candidate_local);
  } while( true );
}

Assistant:

outer_range_iterator skip_while_less (outer_range_iterator range, outer_range_iterator candidate)
        {
            while (range != candidate)
            {
                if (m_compare(range->front(), candidate->front()))
                {
                    skip_to_lower_bound(*range, candidate->front(), m_compare);
                    if (range->empty() || m_compare(candidate->front(), range->front()))
                    {
                        break;
                    }
                }

                ++range;
            }

            return range;
        }